

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::write_escaped_string<char,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,basic_string_view<char> str)

{
  long lVar1;
  size_t sVar2;
  anon_class_8_1_6971b95b_for_f f;
  ulong uVar3;
  buffer<char> *pbVar4;
  string_view s;
  find_escape_result<char> escape;
  find_escape_result<char> local_38;
  
  lVar1 = *(long *)(this + 8);
  uVar3 = lVar1 + 1;
  if (*(ulong *)(this + 0x10) < uVar3) {
    (**(code **)(this + 0x18))(this,uVar3,str.data_,str.size_);
    lVar1 = *(long *)(this + 8);
    uVar3 = lVar1 + 1;
  }
  f.result = *(find_escape_result<char> **)this;
  *(ulong *)(this + 8) = uVar3;
  *(undefined1 *)((long)&(f.result)->begin + lVar1) = 0x22;
  pbVar4 = (buffer<char> *)(str.data_ + out.container);
  do {
    local_38.end = (char *)0x0;
    local_38.cp = 0;
    s.data_ = (char *)((long)pbVar4 - (long)out.container);
    s.size_ = (size_t)&local_38;
    local_38.begin = (char *)pbVar4;
    for_each_codepoint<fmt::v11::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v11::basic_string_view<char>)_1_>
              ((detail *)out.container,s,f);
    buffer<char>::append<char>((buffer<char> *)this,(char *)out.container,local_38.begin);
    out.container = (buffer<char> *)local_38.end;
    if ((buffer<char> *)local_38.end == (buffer<char> *)0x0) break;
    this = (detail *)
           write_escaped_cp<fmt::v11::basic_appender<char>,char>
                     ((basic_appender<char>)this,&local_38);
  } while (out.container != pbVar4);
  sVar2 = ((buffer<char> *)this)->size_;
  uVar3 = sVar2 + 1;
  if (((buffer<char> *)this)->capacity_ < uVar3) {
    (*((buffer<char> *)this)->grow_)((buffer<char> *)this,uVar3);
    sVar2 = ((buffer<char> *)this)->size_;
    uVar3 = sVar2 + 1;
  }
  ((buffer<char> *)this)->size_ = uVar3;
  ((buffer<char> *)this)->ptr_[sVar2] = '\"';
  return (basic_appender<char>)(buffer<char> *)this;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}